

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

CBlockIndex * __thiscall
node::BlockManager::AddToBlockIndex
          (BlockManager *this,CBlockHeader *block,CBlockIndex **best_header)

{
  arith_uint256 *this_00;
  CBlockIndex *pCVar1;
  bool bVar2;
  _Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> _Var3;
  iterator iVar4;
  uint uVar5;
  CBlockIndex *pCVar6;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>,_bool>
  pVar7;
  CBlockIndex *pindexNew;
  base_uint<256U> local_b8;
  base_uint<256U> local_98;
  base_uint<256U> local_78;
  base_uint<256U> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash((uint256 *)&local_58,block);
  pVar7 = std::
          unordered_map<uint256,CBlockIndex,BlockHasher,std::equal_to<uint256>,std::allocator<std::pair<uint256_const,CBlockIndex>>>
          ::try_emplace<CBlockHeader_const&>
                    ((unordered_map<uint256,CBlockIndex,BlockHasher,std::equal_to<uint256>,std::allocator<std::pair<uint256_const,CBlockIndex>>>
                      *)&this->m_block_index,(key_type *)&local_58,block);
  _Var3 = pVar7.first.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar6 = (CBlockIndex *)
             ((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                    _M_cur + 0x28);
    goto LAB_0075ee32;
  }
  pCVar6 = (CBlockIndex *)
           ((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                  _M_cur + 0x28);
  *(undefined4 *)
   ((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur + 0xb4
   ) = 0;
  *(long *)((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                  _M_cur + 0x28) =
       (long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur + 8
  ;
  pindexNew = pCVar6;
  iVar4 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_block_index)._M_h,&block->hashPrevBlock);
  if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur !=
      (__node_type *)0x0) {
    *(long *)((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                    _M_cur + 0x30) =
         (long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur +
         0x28;
    *(int *)((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                   _M_cur + 0x40) =
         *(int *)((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                        ._M_cur + 0x40) + 1;
    CBlockIndex::BuildSkip(pCVar6);
    pCVar6 = pindexNew;
  }
  pCVar1 = pCVar6->pprev;
  if (pCVar1 == (CBlockIndex *)0x0) {
    pCVar6->nTimeMax = pCVar6->nTime;
    base_uint<256U>::base_uint(&local_98,0);
  }
  else {
    uVar5 = pCVar6->nTime;
    if (pCVar6->nTime < pCVar1->nTimeMax) {
      uVar5 = pCVar1->nTimeMax;
    }
    pCVar6->nTimeMax = uVar5;
    base_uint<256U>::base_uint(&local_98,&(pCVar1->nChainWork).super_base_uint<256U>);
  }
  GetBlockProof((arith_uint256 *)&local_b8,pCVar6);
  ::operator+(&local_78,&local_98,&local_b8);
  base_uint<256U>::base_uint(&local_58,&local_78);
  pCVar6 = pindexNew;
  this_00 = &pindexNew->nChainWork;
  base_uint<256U>::operator=(&this_00->super_base_uint<256U>,&local_58);
  CBlockIndex::RaiseValidity(pCVar6,BLOCK_VALID_TREE);
  if (*best_header == (CBlockIndex *)0x0) {
LAB_0075ee18:
    *best_header = pCVar6;
  }
  else {
    bVar2 = ::operator<(&((*best_header)->nChainWork).super_base_uint<256U>,
                        &this_00->super_base_uint<256U>);
    if (bVar2) goto LAB_0075ee18;
  }
  std::
  _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
  ::_M_insert_unique<CBlockIndex*const&>
            ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
              *)&this->m_dirty_blockindex,&pindexNew);
  pCVar6 = pindexNew;
LAB_0075ee32:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pCVar6;
  }
  __stack_chk_fail();
}

Assistant:

CBlockIndex* BlockManager::AddToBlockIndex(const CBlockHeader& block, CBlockIndex*& best_header)
{
    AssertLockHeld(cs_main);

    auto [mi, inserted] = m_block_index.try_emplace(block.GetHash(), block);
    if (!inserted) {
        return &mi->second;
    }
    CBlockIndex* pindexNew = &(*mi).second;

    // We assign the sequence id to blocks only when the full data is available,
    // to avoid miners withholding blocks but broadcasting headers, to get a
    // competitive advantage.
    pindexNew->nSequenceId = 0;

    pindexNew->phashBlock = &((*mi).first);
    BlockMap::iterator miPrev = m_block_index.find(block.hashPrevBlock);
    if (miPrev != m_block_index.end()) {
        pindexNew->pprev = &(*miPrev).second;
        pindexNew->nHeight = pindexNew->pprev->nHeight + 1;
        pindexNew->BuildSkip();
    }
    pindexNew->nTimeMax = (pindexNew->pprev ? std::max(pindexNew->pprev->nTimeMax, pindexNew->nTime) : pindexNew->nTime);
    pindexNew->nChainWork = (pindexNew->pprev ? pindexNew->pprev->nChainWork : 0) + GetBlockProof(*pindexNew);
    pindexNew->RaiseValidity(BLOCK_VALID_TREE);
    if (best_header == nullptr || best_header->nChainWork < pindexNew->nChainWork) {
        best_header = pindexNew;
    }

    m_dirty_blockindex.insert(pindexNew);

    return pindexNew;
}